

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

char * fy_node_get_short_path(fy_node *fyn)

{
  fy_node **ppfVar1;
  long lVar2;
  long lVar3;
  size_t __maxlen;
  int iVar4;
  int iVar5;
  fy_anchor *pfVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  char *pcVar10;
  ulong uVar11;
  fy_node *pfVar12;
  char *__dest;
  char *pcVar13;
  undefined8 uStack_60;
  char acStack_58 [12];
  int local_4c;
  uint local_48 [2];
  size_t len;
  char *local_38;
  
  pcVar7 = acStack_58;
  pfVar12 = fyn;
  if (fyn != (fy_node *)0x0) {
    while( true ) {
      uStack_60 = 0x122347;
      pfVar6 = fy_document_lookup_anchor_by_node(pfVar12->fyd,pfVar12);
      if (pfVar6 != (fy_anchor *)0x0) break;
      ppfVar1 = &pfVar12->parent;
      pfVar12 = *ppfVar1;
      if (*ppfVar1 == (fy_node *)0x0) {
        pcVar7 = fy_node_get_path(fyn);
        return pcVar7;
      }
    }
    pfVar12 = pfVar6->fyn;
    uStack_60 = 0x12237c;
    pcVar8 = fy_token_get_text(pfVar6->anchor,(size_t *)local_48);
    if (pcVar8 != (char *)0x0) {
      if (pfVar12 == fyn) {
        uStack_60 = 0x122409;
        iVar4 = snprintf((char *)0x0,0,"*%.*s",(ulong)local_48[0],pcVar8);
        pcVar13 = (char *)0x0;
        if (iVar4 != -1) {
          lVar2 = -((long)iVar4 + 0x10U & 0xfffffffffffffff0);
          pcVar7 = acStack_58 + lVar2;
          *(undefined8 *)((long)&uStack_60 + lVar2) = 0x122443;
          iVar5 = snprintf(pcVar7,(long)iVar4 + 1,"*%.*s",(ulong)local_48[0],pcVar8);
          if (iVar4 != iVar5) {
            *(code **)((long)&uStack_60 + lVar2) = fy_node_build_from_string;
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                          ,0x116b,"char *fy_node_get_short_path(struct fy_node *)");
          }
          *(undefined8 *)((long)&uStack_60 + lVar2) = 0x122454;
          sVar9 = strlen(pcVar7);
          pcVar13 = pcVar7;
          if (0 < (long)sVar9) {
            pcVar8 = pcVar7 + sVar9;
            do {
              if (pcVar8[-1] != '\n') break;
              pcVar8 = pcVar8 + -1;
              *pcVar8 = '\0';
            } while (pcVar7 < pcVar8);
          }
        }
      }
      else {
        len = CONCAT44(len._4_4_,local_48[0]);
        uStack_60 = 0x12239a;
        pcVar7 = fy_node_get_path_relative_to(pfVar12,fyn);
        if (pcVar7 == (char *)0x0) {
          pcVar13 = (char *)0x0;
          pcVar7 = acStack_58;
        }
        else {
          uStack_60 = 0x1223ae;
          sVar9 = strlen(pcVar7);
          lVar2 = -(sVar9 + 0x10 & 0xfffffffffffffff0);
          pcVar13 = acStack_58 + lVar2;
          local_38 = pcVar8;
          *(undefined8 *)((long)&uStack_60 + lVar2) = 0x1223d4;
          memcpy(pcVar13,pcVar7,sVar9);
          pcVar13[sVar9] = '\0';
          pcVar8 = local_38;
          *(undefined8 *)((long)&uStack_60 + lVar2) = 0x1223e5;
          free(pcVar7);
          pcVar7 = pcVar13;
        }
        if (pcVar13 == (char *)0x0) {
          pcVar13 = "";
        }
        uVar11 = len & 0xffffffff;
        pcVar7[-8] = -0x57;
        pcVar7[-7] = '$';
        pcVar7[-6] = '\x12';
        pcVar7[-5] = '\0';
        pcVar7[-4] = '\0';
        pcVar7[-3] = '\0';
        pcVar7[-2] = '\0';
        pcVar7[-1] = '\0';
        iVar4 = snprintf((char *)0x0,0,"*%.*s/%s",uVar11,pcVar8,pcVar13);
        pcVar13 = (char *)0x0;
        if (iVar4 != -1) {
          len = (long)iVar4 + 1;
          lVar2 = -((long)iVar4 + 0x10U & 0xfffffffffffffff0);
          pcVar13 = pcVar7 + lVar2;
          local_38 = (char *)CONCAT44(local_38._4_4_,local_48[0]);
          pcVar13[-8] = -0x1f;
          pcVar13[-7] = '$';
          pcVar13[-6] = '\x12';
          pcVar13[-5] = '\0';
          pcVar13[-4] = '\0';
          pcVar13[-3] = '\0';
          pcVar13[-2] = '\0';
          pcVar13[-1] = '\0';
          pcVar10 = fy_node_get_path_relative_to(pfVar12,fyn);
          if (pcVar10 == (char *)0x0) {
            __dest = (char *)0x0;
            pcVar7 = pcVar13;
          }
          else {
            pcVar13[-8] = -0xf;
            pcVar13[-7] = '$';
            pcVar13[-6] = '\x12';
            pcVar13[-5] = '\0';
            pcVar13[-4] = '\0';
            pcVar13[-3] = '\0';
            pcVar13[-2] = '\0';
            pcVar13[-1] = '\0';
            sVar9 = strlen(pcVar10);
            lVar3 = -(sVar9 + 0x10 & 0xfffffffffffffff0);
            __dest = pcVar13 + lVar3;
            local_4c = iVar4;
            builtin_strncpy(pcVar7 + lVar3 + lVar2 + -8,"\x1a%\x12",4);
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            memcpy(__dest,pcVar10,sVar9);
            __dest[sVar9] = '\0';
            iVar4 = local_4c;
            builtin_strncpy(pcVar7 + lVar3 + lVar2 + -8,".%\x12",4);
            __dest[-4] = '\0';
            __dest[-3] = '\0';
            __dest[-2] = '\0';
            __dest[-1] = '\0';
            free(pcVar10);
            pcVar7 = __dest;
          }
          __maxlen = len;
          pcVar10 = "";
          if (__dest != (char *)0x0) {
            pcVar10 = __dest;
          }
          uVar11 = (ulong)local_38 & 0xffffffff;
          builtin_strncpy(pcVar7 + -8,"\\%\x12",4);
          pcVar7[-4] = '\0';
          pcVar7[-3] = '\0';
          pcVar7[-2] = '\0';
          pcVar7[-1] = '\0';
          iVar5 = snprintf(pcVar13,__maxlen,"*%.*s/%s",uVar11,pcVar8,pcVar10);
          if (iVar4 != iVar5) {
            pcVar7[-8] = -0x48;
            pcVar7[-7] = '%';
            pcVar7[-6] = '\x12';
            pcVar7[-5] = '\0';
            pcVar7[-4] = '\0';
            pcVar7[-3] = '\0';
            pcVar7[-2] = '\0';
            pcVar7[-1] = '\0';
            __assert_fail("_size == _sizew",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                          ,0x116e,"char *fy_node_get_short_path(struct fy_node *)");
          }
          builtin_strncpy(pcVar7 + -8,"i%\x12",4);
          pcVar7[-4] = '\0';
          pcVar7[-3] = '\0';
          pcVar7[-2] = '\0';
          pcVar7[-1] = '\0';
          sVar9 = strlen(pcVar13);
          if (0 < (long)sVar9) {
            pcVar8 = pcVar13 + sVar9;
            do {
              if (pcVar8[-1] != '\n') break;
              pcVar8 = pcVar8 + -1;
              *pcVar8 = '\0';
            } while (pcVar13 < pcVar8);
          }
        }
      }
      pcVar7[-8] = -0x76;
      pcVar7[-7] = '%';
      pcVar7[-6] = '\x12';
      pcVar7[-5] = '\0';
      pcVar7[-4] = '\0';
      pcVar7[-3] = '\0';
      pcVar7[-2] = '\0';
      pcVar7[-1] = '\0';
      pcVar7 = strdup(pcVar13);
      return pcVar7;
    }
  }
  return (char *)0x0;
}

Assistant:

char *fy_node_get_short_path(struct fy_node *fyn) {
    struct fy_node *fyn_anchor;
    struct fy_anchor *fya;
    const char *text;
    size_t len;
    const char *str;
    char *path;

    if (!fyn)
        return NULL;

    /* get the nearest anchor traversing upwards */
    fya = fy_node_get_nearest_anchor(fyn);
    if (!fya)
        return fy_node_get_path(fyn);

    fyn_anchor = fy_anchor_node(fya);

    text = fy_anchor_get_text(fya, &len);
    if (!text)
        return NULL;

    if (fyn_anchor == fyn)
        str = alloca_sprintf("*%.*s", (int) len, text);
    else
        str = alloca_sprintf("*%.*s/%s", (int) len, text,
                             fy_node_get_path_relative_to_alloca(fyn_anchor, fyn));

    path = strdup(str);
    return path;
}